

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.h
# Opt level: O2

LIndex __thiscall
PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index agI,Index ts)

{
  const_reference this_00;
  const_reference pvVar1;
  
  this_00 = std::
            vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            ::at(&this->_m_firstOHIforT,(ulong)agI);
  pvVar1 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     (this_00,(ulong)ts);
  return *pvVar1;
}

Assistant:

LIndex GetFirstObservationHistoryIndex(Index agI, Index ts) const
        {return _m_firstOHIforT.at(agI).at(ts);}